

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointSendBytes
               (HelicsEndpoint endpoint,void *data,int inputDataLength,HelicsError *err)

{
  bool bVar1;
  undefined7 uVar2;
  int in_R8D;
  
  uVar2 = (undefined7)((ulong)err >> 8);
  if (err == (HelicsError *)0x0) {
    if (endpoint == (HelicsEndpoint)0x0) {
      return;
    }
    if (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((endpoint == (HelicsEndpoint)0x0) || (*(int *)((long)endpoint + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      err->message = "The given endpoint does not point to a valid object";
      return;
    }
  }
  bVar1 = 0 < inputDataLength;
  if (data != (void *)0x0 && bVar1) {
    helics::Endpoint::send
              (*endpoint,(int)data,(void *)(ulong)(uint)inputDataLength,CONCAT71(uVar2,bVar1),in_R8D
              );
  }
  else {
    helics::Endpoint::send
              (*endpoint,(int)gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
               (void *)gHelicsEmptyStr_abi_cxx11_._M_string_length,CONCAT71(uVar2,bVar1),in_R8D);
  }
  return;
}

Assistant:

void helicsEndpointSendBytes(HelicsEndpoint endpoint, const void* data, int inputDataLength, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        if ((data == nullptr) || (inputDataLength <= 0)) {
            endObj->endPtr->send(gHelicsEmptyStr);
        } else {
            endObj->endPtr->send(reinterpret_cast<const char*>(data), inputDataLength);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}